

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sin.c
# Opt level: O0

double c_cos(double x)

{
  int iVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  int local_3c;
  uint local_38;
  int sign;
  int j;
  int i;
  double zz;
  double z;
  double y;
  double x_local;
  
  iVar1 = isnan(x);
  x_local = x;
  if (iVar1 == 0) {
    iVar1 = isfinite(x);
    if (iVar1 == 0) {
      mtherr("cos",1);
      x_local = NAN;
    }
    else {
      local_3c = 1;
      y = x;
      if (x < 0.0) {
        y = -x;
      }
      if (y <= lossth) {
        z = floor(y / PIO4);
        dVar2 = ldexp(z,-4);
        dVar2 = floor(dVar2);
        dVar2 = ldexp(dVar2,4);
        sign = (int)(z - dVar2);
        if ((sign & 1U) != 0) {
          sign = sign + 1;
          z = z + 1.0;
        }
        local_38 = sign & 7;
        if (3 < local_38) {
          local_38 = local_38 - 4;
          local_3c = -1;
        }
        if (1 < (int)local_38) {
          local_3c = -local_3c;
        }
        dVar2 = ((y - z * DP1) - z * DP2) - z * DP3;
        dVar3 = dVar2 * dVar2;
        if ((local_38 == 1) || (local_38 == 2)) {
          dVar3 = polevl(dVar3,sincof,5);
          z = dVar2 + dVar2 * dVar2 * dVar2 * dVar3;
        }
        else {
          dVar2 = ldexp(dVar3,-1);
          dVar4 = polevl(dVar3,coscof,5);
          z = (1.0 - dVar2) + dVar3 * dVar3 * dVar4;
        }
        if (local_3c < 0) {
          z = -z;
        }
        x_local = z;
      }
      else {
        mtherr("cos",5);
        x_local = 0.0;
      }
    }
  }
  return x_local;
}

Assistant:

double c_cos(x)
double x;
{
double y, z, zz;
int i;
int j, sign;

#ifdef NANS
if( isnan(x) )
	return(x);
if( !isfinite(x) )
	{
	mtherr( "cos", DOMAIN );
	return(NAN);
	}
#endif

/* make argument positive */
sign = 1;
if( x < 0 )
	x = -x;

if( x > lossth )
	{
	mtherr( "cos", TLOSS );
	return(0.0);
	}

y = floor( x/PIO4 );
z = ldexp( y, -4 );
z = floor(z);		/* integer part of y/8 */
z = y - ldexp( z, 4 );  /* y - 16 * (y/16) */

/* integer and fractional part modulo one octant */
i = (int)z;
if( i & 1 )	/* map zeros to origin */
	{
	i += 1;
	y += 1.0;
	}
j = i & 07;
if( j > 3)
	{
	j -=4;
	sign = -sign;
	}

if( j > 1 )
	sign = -sign;

/* Extended precision modular arithmetic */
z = ((x - y * DP1) - y * DP2) - y * DP3;

zz = z * z;

if( (j==1) || (j==2) )
	{
/*	y = z  +  z * (zz * polevl( zz, sincof, 5 ));*/
	y = z  +  z * z * z * polevl( zz, sincof, 5 );
	}
else
	{
	y = 1.0 - ldexp(zz,-1) + zz * zz * polevl( zz, coscof, 5 );
	}

if(sign < 0)
	y = -y;

return(y);
}